

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O3

bool EV_Teleport(int tid,int tag,line_t *line,int side,AActor *thing,int flags)

{
  APlayerPawn *pAVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  AActor *pAVar7;
  PClass *pPVar8;
  PClass *pPVar9;
  undefined4 extraout_var;
  int iVar10;
  byte bVar11;
  ulong uVar12;
  bool bVar13;
  double dVar14;
  ulong extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined4 uVar15;
  NActorIterator iterator;
  NActorIterator it2;
  FName local_cc;
  uint local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  line_t *local_b8;
  ulong uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  undefined1 local_80 [24];
  NActorIterator local_68;
  DAngle local_50;
  DVector3 local_48;
  
  if (thing == (AActor *)0x0) goto LAB_005747eb;
  if (thing->player == (player_t *)0x0) {
    bVar11 = 0;
  }
  else {
    bVar11 = (*(byte *)((long)&thing->player->cheats + 1) & 0x20) >> 5;
  }
  uVar12 = 0;
  if (((thing->flags2).Value & 0x80) != 0 || side != 0) goto LAB_005747ee;
  if (((byte)ib_compatflags & 8) == 0) {
    uVar12 = (ulong)(uint)tag;
  }
  iVar6 = (int)uVar12;
  local_c8 = flags;
  local_b8 = line;
  if (tid == 0) {
    if (iVar6 != 0) {
      local_68.super_FActorIterator.base =
           (AActor *)CONCAT44(tagManager.TagHashFirst[uVar12 & 0xff],iVar6);
      uVar5 = FSectorTagIterator::Next((FSectorTagIterator *)&local_68);
      if (-1 < (int)uVar5) {
        do {
          local_cc.Index = 0x77;
          pPVar8 = PClass::FindClass(&local_cc);
          FThinkerIterator::FThinkerIterator((FThinkerIterator *)local_80,pPVar8,0x80);
          while (pAVar7 = (AActor *)FThinkerIterator::Next((FThinkerIterator *)local_80),
                pAVar7 != (AActor *)0x0) {
            if (pAVar7->Sector == sectors + uVar5) goto LAB_005745a4;
          }
          uVar5 = FSectorTagIterator::Next((FSectorTagIterator *)&local_68);
        } while (-1 < (int)uVar5);
      }
    }
  }
  else {
    local_80._0_8_ = (AActor *)0x0;
    local_68.super_FActorIterator.base =
         (AActor *)CONCAT44(local_68.super_FActorIterator.base._4_4_,0x77);
    local_80._8_4_ = tid;
    local_80._16_8_ = PClass::FindClass((FName *)&local_68);
    pAVar7 = NActorIterator::Next((NActorIterator *)local_80);
    if (pAVar7 == (AActor *)0x0) {
LAB_005743f4:
      if (iVar6 != 0) goto LAB_005747eb;
      local_68.super_FActorIterator.base = (AActor *)0x0;
      local_cc.Index = 0x104;
      local_68.super_FActorIterator.id = tid;
      local_68.type = PClass::FindClass(&local_cc);
      pAVar7 = NActorIterator::Next(&local_68);
      if (pAVar7 == (AActor *)0x0) {
        for (pAVar7 = AActor::TIDHash[tid & 0x7f]; pAVar7 != (AActor *)0x0; pAVar7 = pAVar7->inext)
        {
          if (pAVar7->tid == tid) goto LAB_00574530;
        }
LAB_00574803:
        pAVar7 = (AActor *)0x0;
      }
    }
    else {
      iVar10 = 0;
      do {
        if ((iVar6 == 0) ||
           (bVar3 = FTagManager::SectorHasTag(&tagManager,pAVar7->Sector,iVar6), bVar3)) {
          iVar10 = iVar10 + 1;
        }
        pAVar7 = NActorIterator::Next((NActorIterator *)local_80);
      } while (pAVar7 != (AActor *)0x0);
      if (iVar10 != 1) {
        if (iVar10 == 0) goto LAB_005743f4;
        if (bVar11 == 0) {
          uVar5 = FRandom::GenRand32(&pr_teleport);
          iVar10 = (int)((long)(ulong)(uVar5 & 0xff) % (long)iVar10) + 1;
        }
        else if (iVar10 < 1) goto LAB_005747eb;
      }
      do {
        pAVar7 = NActorIterator::Next((NActorIterator *)local_80);
        if ((iVar6 == 0) ||
           (bVar3 = FTagManager::SectorHasTag(&tagManager,pAVar7->Sector,iVar6), bVar3)) {
          iVar10 = iVar10 + -1;
        }
      } while (0 < iVar10);
    }
LAB_0057459b:
    if (pAVar7 != (AActor *)0x0) {
LAB_005745a4:
      uVar5 = local_c8;
      bVar3 = (local_c8 & 0x60) == 0;
      bVar13 = local_b8 == (line_t *)0x0;
      if (bVar13 || bVar3) {
        local_80._0_4_ = 0x78;
        pPVar9 = PClass::FindClass((FName *)local_80);
        pPVar8 = (pAVar7->super_DThinker).super_DObject.Class;
        if (pPVar8 == (PClass *)0x0) {
          iVar6 = (**(pAVar7->super_DThinker).super_DObject._vptr_DObject)(pAVar7);
          pPVar8 = (PClass *)CONCAT44(extraout_var,iVar6);
          (pAVar7->super_DThinker).super_DObject.Class = pPVar8;
        }
        bVar4 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar9 && bVar4) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar4 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar9) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        uVar15 = 0;
        uStack_c4 = 0;
        uStack_c0 = 0;
        uStack_bc = 0;
        local_b8 = (line_t *)0x0;
        uStack_b0 = 0;
        if (bVar4) {
          local_98 = 0.0;
          uStack_90 = 0;
          local_a8 = 0.0;
          uStack_a0 = 0;
          goto LAB_005746c1;
        }
        local_48.Z = -2147483648.0;
        local_98 = 0.0;
        uStack_90 = 0;
        local_a8 = 0.0;
        uStack_a0 = 0;
      }
      else {
        dVar14 = c_atan2((local_b8->delta).Y,(local_b8->delta).X);
        local_b8 = (line_t *)((dVar14 * 57.29577951308232 - (pAVar7->Angles).Yaw.Degrees) + 90.0);
        uStack_b0 = extraout_XMM0_Qb;
        if ((uVar5 & 0x40) != 0) {
          local_b8 = (line_t *)-(double)local_b8;
          uStack_b0 = extraout_XMM0_Qb ^ 0x8000000000000000;
        }
        local_98 = FFastTrig::sin(&fasttrig,(double)local_b8);
        uStack_90 = extraout_XMM0_Qb_00;
        local_a8 = FFastTrig::cos(&fasttrig,local_98);
        uVar15 = *(undefined4 *)&(thing->Vel).X;
        uStack_c4 = *(undefined4 *)((long)&(thing->Vel).X + 4);
        uStack_c0 = *(undefined4 *)&(thing->Vel).Y;
        uStack_bc = *(undefined4 *)((long)&(thing->Vel).Y + 4);
        uStack_a0 = extraout_XMM0_Qb_01;
LAB_005746c1:
        local_48.Z = (pAVar7->__Pos).Z;
      }
      dVar14 = 0.0;
      if ((((byte)i_compatflags2 & 1) != 0) && (thing->player != (player_t *)0x0)) {
        dVar14 = 0.01;
      }
      local_48.X = (pAVar7->__Pos).X;
      local_48.Y = (pAVar7->__Pos).Y;
      local_50.Degrees = dVar14 + (pAVar7->Angles).Yaw.Degrees;
      uVar5 = local_c8;
      local_c8 = uVar15;
      bVar4 = P_Teleport(thing,&local_48,&local_50,uVar5);
      if (bVar4) {
        dVar14 = (double)CONCAT44(uStack_c4,local_c8);
        dVar2 = (double)CONCAT44(uStack_bc,uStack_c0);
        if (!bVar13 && !bVar3) {
          (thing->Angles).Yaw.Degrees = (double)local_b8 + (thing->Angles).Yaw.Degrees;
          (thing->Vel).X = local_a8 * dVar14 - dVar2 * local_98;
          (thing->Vel).Y = dVar14 * local_98 + local_a8 * dVar2;
        }
        uVar12 = 1;
        if ((((dVar14 == 0.0) && (!NAN(dVar14))) && (dVar2 == 0.0)) &&
           (((!NAN(dVar2) && (thing->player != (player_t *)0x0)) &&
            (pAVar1 = thing->player->mo, pAVar1 == (APlayerPawn *)thing && bVar11 == 0)))) {
          (*(pAVar1->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x25])();
        }
        goto LAB_005747ee;
      }
    }
  }
LAB_005747eb:
  uVar12 = 0;
LAB_005747ee:
  return SUB81(uVar12,0);
LAB_00574530:
  while (((pAVar7->flags).Value & 2) != 0) {
    do {
      pAVar7 = pAVar7->inext;
      if (pAVar7 == (AActor *)0x0) goto LAB_00574803;
    } while (pAVar7->tid != tid);
  }
  goto LAB_0057459b;
}

Assistant:

bool EV_Teleport (int tid, int tag, line_t *line, int side, AActor *thing, int flags)
{
	AActor *searcher;
	double z;
	DAngle angle = 0.;
	double s = 0, c = 0;
	double vx = 0, vy = 0;
	DAngle badangle = 0.;

	if (thing == NULL)
	{ // Teleport function called with an invalid actor
		return false;
	}
	bool predicting = (thing->player && (thing->player->cheats & CF_PREDICTING));
	if (thing->flags2 & MF2_NOTELEPORT)
	{
		return false;
	}
	if (side != 0)
	{ // Don't teleport if hit back of line, so you can get out of teleporter.
		return 0;
	}
	searcher = SelectTeleDest(tid, tag, predicting);
	if (searcher == NULL)
	{
		return false;
	}
	// [RH] Lee Killough's changes for silent teleporters from BOOM
	if ((flags & (TELF_ROTATEBOOM|TELF_ROTATEBOOMINVERSE)) && line)
	{
		// Get the angle between the exit thing and source linedef.
		// Rotate 90 degrees, so that walking perpendicularly across
		// teleporter linedef causes thing to exit in the direction
		// indicated by the exit thing.
		angle = line->Delta().Angle() - searcher->Angles.Yaw + 90.;
		if (flags & TELF_ROTATEBOOMINVERSE) angle = -angle;

		// Sine, cosine of angle adjustment
		s = angle.Sin();
		c = angle.Cos();

		// Velocity of thing crossing teleporter linedef
		vx = thing->Vel.X;
		vy = thing->Vel.Y;

		z = searcher->Z();
	}
	else if (searcher->IsKindOf (PClass::FindClass(NAME_TeleportDest2)))
	{
		z = searcher->Z();
	}
	else
	{
		z = ONFLOORZ;
	}
	if ((i_compatflags2 & COMPATF2_BADANGLES) && (thing->player != NULL))
	{
		badangle = 0.01;
	}
	if (P_Teleport (thing, DVector3(searcher->Pos(), z), searcher->Angles.Yaw + badangle, flags))
	{
		// [RH] Lee Killough's changes for silent teleporters from BOOM
		if (line)
		{
			if (flags & (TELF_ROTATEBOOM| TELF_ROTATEBOOMINVERSE))
			{
				// Rotate thing according to difference in angles (or not - Boom got the direction wrong here.)
				thing->Angles.Yaw += angle;

				// Rotate thing's velocity to come out of exit just like it entered
				thing->Vel.X = vx*c - vy*s;
				thing->Vel.Y = vy*c + vx*s;
			}
		}
		if (vx == 0 && vy == 0 && thing->player != NULL && thing->player->mo == thing && !predicting)
		{
			thing->player->mo->PlayIdle ();
		}
		return true;
	}
	return false;
}